

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O2

_Bool is_quest(player *p,wchar_t level)

{
  long lVar1;
  uint8_t *puVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  
  if (level == L'\0') {
    return false;
  }
  lVar4 = 0;
  do {
    lVar1 = lVar4 + 0x30;
    bVar5 = (ulong)z_info->quest_max * 0x30 + 0x30 == lVar1;
    bVar3 = !bVar5;
    if (bVar5) {
      return bVar3;
    }
    puVar2 = &p->quests->level + lVar4;
    lVar4 = lVar1;
  } while ((uint)*puVar2 != level);
  return bVar3;
}

Assistant:

bool is_quest(struct player *p, int level)
{
	size_t i;

	/* Town is never a quest */
	if (!level) return false;

	for (i = 0; i < z_info->quest_max; i++)
		if (p->quests[i].level == level)
			return true;

	return false;
}